

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

bool __thiscall
soplex::SPxLPBase<double>::readMPS
          (SPxLPBase<double> *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars)

{
  LPColSetBase<double> *this_00;
  VectorBase<double> *pVVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  NameSet *pNVar7;
  NameSet *this_01;
  bool bVar8;
  int iVar9;
  int i;
  uint uVar10;
  char *pcVar11;
  size_t sVar12;
  pointer pdVar13;
  SPxOut *pSVar14;
  int __c;
  long in_FS_OFFSET;
  double dVar15;
  double dVar16;
  double dVar17;
  _func_int *p_Var18;
  NameSet *rnames;
  Verbosity old_verbosity_1;
  MPSInput mps;
  Verbosity old_verbosity;
  char colname [256];
  _func_int *local_648;
  NameSet *local_618;
  NameSet *local_610;
  _func_int *local_608;
  undefined8 uStack_600;
  SPxOut *local_5f8;
  SPxLPBase<double> *local_5f0;
  DIdxSet *local_5e8;
  DataKey local_5e0;
  DSVectorBase<double> local_5d8;
  LPColSetBase<double> *local_5b8;
  NameSet *local_5b0;
  NameSet *local_5a8;
  SPxOut *local_5a0;
  MPSInput local_598;
  LPColBase<double> local_238 [4];
  LPRowBase<double> local_138 [4];
  undefined1 local_39;
  
  local_5e8 = p_intvars;
  local_5b0 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_618 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_618,1);
    p_cnames = local_618;
    NameSet::NameSet(local_618,10000,-1,2.0,2.0);
  }
  local_618 = p_cnames;
  NameSet::clear(p_cnames);
  local_5a8 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_610 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_610,1);
    p_rnames = local_610;
    NameSet::NameSet(local_610,10000,-1,2.0,2.0);
  }
  this_00 = &this->super_LPColSetBase<double>;
  local_610 = p_rnames;
  NameSet::clear(p_rnames);
  LPRowSetBase<double>::clear(&this->super_LPRowSetBase<double>);
  LPColSetBase<double>::clear(this_00);
  this->thesense = MAXIMIZE;
  this->offset = 0.0;
  this->_isScaled = false;
  this->lp_scaler = (SPxScaler<double> *)0x0;
  (this->super_LPColSetBase<double>).scaleExp.thesize = 0;
  (this->super_LPRowSetBase<double>).scaleExp.thesize = 0;
  SVSetBase<double>::memRemax(&this_00->super_SVSetBase<double>,100000);
  local_5b8 = this_00;
  LPColSetBase<double>::reMax(this_00,10000);
  local_598._vptr_MPSInput = (_func_int **)&PTR__MPSInput_006a9fa8;
  local_598.m_section = NAME;
  local_598.m_lineno = 0;
  local_598.m_objsense = MINIMIZE;
  local_598.m_has_error = false;
  local_598.m_buf[0] = '\0';
  local_598.m_is_integer = false;
  local_598.m_is_new_format = false;
  local_598.m_ignored = 0;
  local_598.m_objname[0] = '\0';
  local_598.m_f0 = (char *)0x0;
  local_598.m_f1 = (char *)0x0;
  local_598.m_f2 = (char *)0x0;
  local_598.m_f3 = (char *)0x0;
  local_598.m_f4 = (char *)0x0;
  local_598.m_f5 = (char *)0x0;
  local_598.m_probname[0] = '\0';
  local_598.m_input = p_input;
  MPSreadName(&local_598,this->spxout);
  if (local_598.m_section == OBJSEN) {
    MPSreadObjsen(&local_598);
  }
  if (local_598.m_section == OBJNAME) {
    bVar8 = MPSInput::readLine(&local_598);
    if ((bVar8) && (local_598.m_f1 != (char *)0x0)) {
      spxSnprintf(local_598.m_objname,0x100,"%s");
      bVar8 = MPSInput::readLine(&local_598);
      if ((bVar8) &&
         ((local_598.m_f0 != (char *)0x0 && (iVar9 = strcmp(local_598.m_f0,"ROWS"), iVar9 == 0)))) {
        local_598.m_section = ROWS;
        goto LAB_001ae858;
      }
    }
    MPSInput::syntaxError(&local_598);
  }
LAB_001ae858:
  pNVar7 = local_610;
  if (local_598.m_section == ROWS) {
    pSVar14 = this->spxout;
    LPRowBase<double>::LPRowBase(local_138,0);
    dVar17 = *(double *)(in_FS_OFFSET + -8);
    while (bVar8 = MPSInput::readLine(&local_598), bVar8) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((pSVar14 != (SPxOut *)0x0) && (3 < (int)pSVar14->m_verbosity)) {
          local_238[0].up = (double)CONCAT44(local_238[0].up._4_4_,pSVar14->m_verbosity);
          local_5d8._vptr_DSVectorBase =
               (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,4);
          (*pSVar14->_vptr_SPxOut[2])(pSVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar14->m_streams[pSVar14->m_verbosity],"IMPSRD02 Objective name : ",0x1a);
          poVar4 = pSVar14->m_streams[pSVar14->m_verbosity];
          sVar12 = strlen(local_598.m_objname);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_598.m_objname,sVar12);
          cVar2 = (char)pSVar14->m_streams[pSVar14->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar14->m_streams[pSVar14->m_verbosity] + -0x18) + cVar2
                         );
          std::ostream::put(cVar2);
          std::ostream::flush();
          (*pSVar14->_vptr_SPxOut[2])(pSVar14,local_238);
        }
        iVar9 = strcmp(local_598.m_f0,"COLUMNS");
        if (iVar9 == 0) {
          local_598.m_section = COLUMNS;
          goto LAB_001aeaf7;
        }
        break;
      }
      if ((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) break;
      if (*local_598.m_f1 == 'N') {
        if (local_598.m_objname[0] == '\0') {
          spxSnprintf(local_598.m_objname,0x100,"%s");
        }
      }
      else {
        local_238[0].up = (double)local_598.m_f2;
        pcVar11 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                            (&pNVar7->hashtab,(char *)local_238,__c);
        if (-1 < (int)pcVar11) break;
        NameSet::add(pNVar7,local_598.m_f2);
        cVar2 = *local_598.m_f1;
        if (cVar2 == 'E') {
          local_138[0].left = 0.0;
          local_138[0].right = 0.0;
        }
        else if (cVar2 == 'L') {
          ::soplex::infinity::__tls_init();
          local_138[0].right = 0.0;
          local_138[0].left = -dVar17;
        }
        else {
          if (cVar2 != 'G') break;
          local_138[0].left = 0.0;
          ::soplex::infinity::__tls_init();
          local_138[0].right = dVar17;
        }
        local_238[0].up = -NAN;
        LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,(DataKey *)local_238,local_138);
      }
    }
    MPSInput::syntaxError(&local_598);
LAB_001aeaf7:
    local_138[0].vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
    if (local_138[0].vec.theelem != (Nonzero<double> *)0x0) {
      free(local_138[0].vec.theelem);
      local_138[0].vec.theelem = (Nonzero<double> *)0x0;
    }
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this);
  this_01 = local_610;
  pNVar7 = local_618;
  if (local_598.m_section == COLUMNS) {
    memset(local_138,0,0x100);
    LPColBase<double>::LPColBase
              (local_238,(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    local_5d8.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    local_5d8.super_SVectorBase<double>.memsize = 0;
    local_5d8.super_SVectorBase<double>.memused = 0;
    local_5d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
    local_5d8.theelem = (Nonzero<double> *)0x0;
    spx_alloc<soplex::Nonzero<double>*>(&local_5d8.theelem,8);
    local_5d8.super_SVectorBase<double>.m_elem = local_5d8.theelem;
    local_5d8.super_SVectorBase<double>.memsize = 8;
    local_5d8.super_SVectorBase<double>.memused = 0;
    local_238[0].object = 0.0;
    pcVar11 = *(char **)(in_FS_OFFSET + -8);
    dVar17 = local_238[0].object;
    while (local_238[0].object = dVar17, bVar8 = MPSInput::readLine(&local_598), bVar8) {
      if (local_598.m_f0 != (char *)0x0) {
        iVar9 = strcmp(local_598.m_f0,"RHS");
        if (iVar9 == 0) {
          if (local_138[0].left._0_1_ != '\0') {
            DSVectorBase<double>::operator=(&local_238[0].vec,&local_5d8.super_SVectorBase<double>);
            local_5e0.info = 0;
            local_5e0.idx = -1;
            LPColSetBase<double>::add(local_5b8,&local_5e0,local_238);
          }
          local_598.m_section = RHS;
          goto LAB_001aef5e;
        }
        break;
      }
      if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
         (local_598.m_f3 == (char *)0x0)) break;
      iVar9 = strcmp((char *)local_138,local_598.m_f1);
      if (iVar9 != 0) {
        if (local_138[0].left._0_1_ != '\0') {
          DSVectorBase<double>::operator=(&local_238[0].vec,&local_5d8.super_SVectorBase<double>);
          local_5e0.info = 0;
          local_5e0.idx = -1;
          LPColSetBase<double>::add(local_5b8,&local_5e0,local_238);
        }
        spxSnprintf((char *)local_138,0xff,"%s",local_598.m_f1);
        local_39 = 0;
        iVar9 = (pNVar7->set).thesize;
        NameSet::add(pNVar7,(char *)local_138);
        iVar3 = (pNVar7->set).thesize;
        if (iVar9 < iVar3) {
          local_5d8.super_SVectorBase<double>._8_8_ =
               local_5d8.super_SVectorBase<double>._8_8_ & 0xffffffff;
          local_238[0].low = 0.0;
          local_238[0].object = 0.0;
          ::soplex::infinity::__tls_init();
          local_238[0].up = (double)pcVar11;
          if (local_598.m_is_integer == true) {
            if (local_5e8 != (DIdxSet *)0x0) {
              i = NameSet::number(pNVar7,(char *)local_138);
              DIdxSet::addIdx(local_5e8,i);
            }
            local_238[0].up = 1.0;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR in COLUMNS: duplicate column name or not column-wise ordering",0x43);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
        if (iVar3 <= iVar9) break;
      }
      dVar15 = atof(local_598.m_f3);
      pcVar5 = local_598.m_f2;
      iVar9 = strcmp(local_598.m_f2,local_598.m_objname);
      dVar17 = dVar15;
      if (iVar9 != 0) {
        iVar9 = NameSet::number(this_01,pcVar5);
        if (iVar9 < 0) {
          MPSInput::entryIgnored(&local_598,"Column",local_598.m_f1,"row",local_598.m_f2);
          dVar17 = local_238[0].object;
        }
        else if ((dVar15 != 0.0) || (dVar17 = local_238[0].object, NAN(dVar15))) {
          DSVectorBase<double>::makeMem(&local_5d8,1);
          local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
          idx = iVar9;
          local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
          val = dVar15;
          local_5d8.super_SVectorBase<double>.memused =
               local_5d8.super_SVectorBase<double>.memused + 1;
          dVar17 = local_238[0].object;
        }
      }
      local_238[0].object = dVar17;
      dVar17 = local_238[0].object;
      if (local_598.m_f5 != (char *)0x0) {
        dVar15 = atof(local_598.m_f5);
        pcVar5 = local_598.m_f4;
        iVar9 = strcmp(local_598.m_f4,local_598.m_objname);
        dVar17 = dVar15;
        if (iVar9 != 0) {
          iVar9 = NameSet::number(this_01,pcVar5);
          if (iVar9 < 0) {
            MPSInput::entryIgnored(&local_598,"Column",local_598.m_f1,"row",local_598.m_f4);
            dVar17 = local_238[0].object;
          }
          else if ((dVar15 != 0.0) || (dVar17 = local_238[0].object, NAN(dVar15))) {
            DSVectorBase<double>::makeMem(&local_5d8,1);
            local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
            idx = iVar9;
            local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
            val = dVar15;
            local_5d8.super_SVectorBase<double>.memused =
                 local_5d8.super_SVectorBase<double>.memused + 1;
            dVar17 = local_238[0].object;
          }
        }
      }
    }
    MPSInput::syntaxError(&local_598);
LAB_001aef5e:
    local_5d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
    if (local_5d8.theelem != (Nonzero<double> *)0x0) {
      free(local_5d8.theelem);
      local_5d8.theelem = (Nonzero<double> *)0x0;
    }
    local_238[0].vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
    if (local_238[0].vec.theelem != (Nonzero<double> *)0x0) {
      free(local_238[0].vec.theelem);
      local_238[0].vec.theelem = (Nonzero<double> *)0x0;
    }
  }
  pNVar7 = local_610;
  if (local_598.m_section == RHS) {
    pSVar14 = this->spxout;
    memset(local_138,0,0x100);
    memset(local_238,0,0x100);
    bVar8 = MPSInput::readLine(&local_598);
    if (bVar8) {
      dVar17 = *(double *)(in_FS_OFFSET + -8);
      local_5f0 = this;
      while (local_598.m_f0 == (char *)0x0) {
        if (((local_598.m_f2 != (char *)0x0) && (local_598.m_f3 == (char *)0x0)) ||
           ((local_598.m_f4 != (char *)0x0 && (local_598.m_f5 == (char *)0x0)))) {
          MPSInput::insertName(&local_598,"_RHS_",false);
        }
        if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
           (local_598.m_f3 == (char *)0x0)) goto LAB_001af4cf;
        if (local_138[0].left._0_1_ == '\0') {
          spxSnprintf((char *)local_138,0x100,"%s");
        }
        pcVar11 = local_598.m_f1;
        iVar9 = strcmp((char *)local_138,local_598.m_f1);
        if (iVar9 == 0) {
          uVar10 = NameSet::number(pNVar7,local_598.m_f2);
          if ((int)uVar10 < 0) {
            MPSInput::entryIgnored(&local_598,"RHS",local_598.m_f1,"row",local_598.m_f2);
          }
          else {
            local_608 = (_func_int *)atof(local_598.m_f3);
            dVar15 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
            ::soplex::infinity::__tls_init();
            if (dVar15 < dVar17) {
              (this->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] = (double)local_608;
            }
            dVar15 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
            ::soplex::infinity::__tls_init();
            if (-dVar17 < dVar15) {
              (this->super_LPRowSetBase<double>).left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] = (double)local_608;
            }
          }
          if (local_598.m_f5 != (char *)0x0) {
            uVar10 = NameSet::number(pNVar7,local_598.m_f4);
            if ((int)uVar10 < 0) {
              MPSInput::entryIgnored(&local_598,"RHS",local_598.m_f1,"row",local_598.m_f4);
            }
            else {
              local_608 = (_func_int *)atof(local_598.m_f5);
              dVar15 = (this->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if (dVar15 < dVar17) {
                (this->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10] = (double)local_608;
              }
              dVar15 = (this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if (-dVar17 < dVar15) {
                (this->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10] = (double)local_608;
              }
            }
          }
        }
        else {
          iVar9 = strcmp((char *)local_238,pcVar11);
          if (((iVar9 != 0) &&
              (spxSnprintf((char *)local_238,0x100,"%s",pcVar11), pSVar14 != (SPxOut *)0x0)) &&
             (4 < (int)pSVar14->m_verbosity)) {
            local_5d8._vptr_DSVectorBase =
                 (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,pSVar14->m_verbosity);
            local_5e0.info = 5;
            (*pSVar14->_vptr_SPxOut[2])(pSVar14,&local_5e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar14->m_streams[pSVar14->m_verbosity],"IMPSRD07 RHS ignored    : ",0x1a);
            poVar4 = pSVar14->m_streams[pSVar14->m_verbosity];
            sVar12 = strlen((char *)local_238);
            this = local_5f0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_238,sVar12);
            cVar2 = (char)pSVar14->m_streams[pSVar14->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar14->m_streams[pSVar14->m_verbosity] + -0x18) +
                            cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
            (*pSVar14->_vptr_SPxOut[2])(pSVar14);
          }
        }
        bVar8 = MPSInput::readLine(&local_598);
        if (!bVar8) goto LAB_001af4cf;
      }
      if ((pSVar14 != (SPxOut *)0x0) && (3 < (int)pSVar14->m_verbosity)) {
        local_5d8._vptr_DSVectorBase =
             (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,pSVar14->m_verbosity);
        local_5e0.info = 4;
        (*pSVar14->_vptr_SPxOut[2])(pSVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar14->m_streams[pSVar14->m_verbosity],"IMPSRD03 RHS name       : ",0x1a);
        poVar4 = pSVar14->m_streams[pSVar14->m_verbosity];
        sVar12 = strlen((char *)local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar12);
        cVar2 = (char)pSVar14->m_streams[pSVar14->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar14->m_streams[pSVar14->m_verbosity] + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        (*pSVar14->_vptr_SPxOut[2])(pSVar14,&local_5d8);
      }
      pcVar11 = local_598.m_f0;
      iVar9 = strcmp(local_598.m_f0,"RANGES");
      if (iVar9 == 0) {
        local_598.m_section = RANGES;
        goto LAB_001af4dc;
      }
      iVar9 = strcmp(pcVar11,"BOUNDS");
      if (iVar9 == 0) {
        local_598.m_section = BOUNDS;
        goto LAB_001af4dc;
      }
      iVar9 = strcmp(pcVar11,"ENDATA");
      if (iVar9 == 0) {
        local_598.m_section = ENDATA;
        goto LAB_001af4dc;
      }
    }
LAB_001af4cf:
    MPSInput::syntaxError(&local_598);
  }
LAB_001af4dc:
  pNVar7 = local_610;
  if (local_598.m_section == RANGES) {
    pSVar14 = this->spxout;
    memset(local_138,0,0x100);
    bVar8 = MPSInput::readLine(&local_598);
    local_5f8 = pSVar14;
    if (bVar8) {
      local_608 = *(_func_int **)(in_FS_OFFSET + -8);
      uStack_600 = 0;
      dVar17 = -(double)local_608;
      while (pSVar14 = local_5f8, local_598.m_f0 == (char *)0x0) {
        if (((local_598.m_f2 != (char *)0x0) && (local_598.m_f3 == (char *)0x0)) ||
           ((local_598.m_f4 != (char *)0x0 && (local_598.m_f5 == (char *)0x0)))) {
          MPSInput::insertName(&local_598,"_RNG_",false);
        }
        if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
           (local_598.m_f3 == (char *)0x0)) goto LAB_001af9b0;
        if (local_138[0].left._0_1_ == '\0') {
          spxSnprintf((char *)local_138,0x100,"%s");
        }
        iVar9 = strcmp((char *)local_138,local_598.m_f1);
        if (iVar9 == 0) {
          uVar10 = NameSet::number(pNVar7,local_598.m_f2);
          if ((int)uVar10 < 0) {
            MPSInput::entryIgnored(&local_598,"Range",local_598.m_f1,"row",local_598.m_f2);
          }
          else {
            dVar16 = atof(local_598.m_f3);
            dVar15 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
            ::soplex::infinity::__tls_init();
            if ((dVar15 <= dVar17) ||
               (dVar15 = (this->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10], ::soplex::infinity::__tls_init(),
               (double)local_608 <= dVar15)) {
              dVar15 = (this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if (dVar17 < dVar15) {
                (this->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10] =
                     ABS(dVar16) +
                     (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
                goto LAB_001af75c;
              }
              pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar16 = (this->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10] - ABS(dVar16);
            }
            else {
              if (0.0 <= dVar16) {
                pdVar13 = (this->super_LPRowSetBase<double>).right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              dVar16 = pdVar13[uVar10] + dVar16;
            }
            pdVar13[uVar10] = dVar16;
          }
LAB_001af75c:
          if (local_598.m_f5 != (char *)0x0) {
            uVar10 = NameSet::number(pNVar7,local_598.m_f4);
            if ((int)uVar10 < 0) {
              MPSInput::entryIgnored(&local_598,"Range",local_598.m_f1,"row",local_598.m_f4);
            }
            else {
              dVar16 = atof(local_598.m_f5);
              dVar15 = (this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if ((dVar15 <= dVar17) ||
                 (dVar15 = (this->super_LPRowSetBase<double>).right.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10],
                 ::soplex::infinity::__tls_init(), (double)local_608 <= dVar15)) {
                dVar15 = (this->super_LPRowSetBase<double>).left.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10];
                ::soplex::infinity::__tls_init();
                if (dVar17 < dVar15) {
                  (this->super_LPRowSetBase<double>).right.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] =
                       ABS(dVar16) +
                       (this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
                  goto LAB_001af60d;
                }
                pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                dVar16 = (this->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10] - ABS(dVar16);
              }
              else {
                if (0.0 <= dVar16) {
                  pdVar13 = (this->super_LPRowSetBase<double>).right.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                }
                else {
                  pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                }
                dVar16 = pdVar13[uVar10] + dVar16;
              }
              pdVar13[uVar10] = dVar16;
            }
          }
        }
LAB_001af60d:
        bVar8 = MPSInput::readLine(&local_598);
        if (!bVar8) goto LAB_001af9b0;
      }
      if ((local_5f8 != (SPxOut *)0x0) && (3 < (int)local_5f8->m_verbosity)) {
        local_238[0].up = (double)CONCAT44(local_238[0].up._4_4_,local_5f8->m_verbosity);
        local_5d8._vptr_DSVectorBase = (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,4);
        (*local_5f8->_vptr_SPxOut[2])(local_5f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar14->m_streams[pSVar14->m_verbosity],"IMPSRD04 Range name     : ",0x1a);
        poVar4 = pSVar14->m_streams[pSVar14->m_verbosity];
        sVar12 = strlen((char *)local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar12);
        cVar2 = (char)pSVar14->m_streams[pSVar14->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar14->m_streams[pSVar14->m_verbosity] + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        (*pSVar14->_vptr_SPxOut[2])(pSVar14,local_238);
      }
      pcVar11 = local_598.m_f0;
      iVar9 = strcmp(local_598.m_f0,"BOUNDS");
      if (iVar9 == 0) {
        local_598.m_section = BOUNDS;
        goto LAB_001af9bd;
      }
      iVar9 = strcmp(pcVar11,"ENDATA");
      if (iVar9 == 0) {
        local_598.m_section = ENDATA;
        goto LAB_001af9bd;
      }
    }
LAB_001af9b0:
    MPSInput::syntaxError(&local_598);
  }
LAB_001af9bd:
  pNVar7 = local_618;
  if (local_598.m_section == BOUNDS) {
    local_5a0 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)local_238,8);
    memset(local_138,0,0x100);
    local_608 = *(_func_int **)(in_FS_OFFSET + -8);
    uStack_600 = 0;
    p_Var18 = (_func_int *)((ulong)local_608 ^ 0x8000000000000000);
    pVVar1 = &(this->super_LPColSetBase<double>).up;
    local_5f8 = (SPxOut *)&(this->super_LPColSetBase<double>).low;
    local_5f0 = this;
LAB_001afa58:
    bVar8 = MPSInput::readLine(&local_598);
    pcVar11 = local_598.m_f1;
    pSVar14 = local_5a0;
    if (bVar8) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((local_5a0 != (SPxOut *)0x0) && (3 < (int)local_5a0->m_verbosity)) {
          local_5d8._vptr_DSVectorBase =
               (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,local_5a0->m_verbosity);
          local_5e0.info = 4;
          (*local_5a0->_vptr_SPxOut[2])(local_5a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar14->m_streams[pSVar14->m_verbosity],"IMPSRD05 Bound name     : ",0x1a);
          poVar4 = pSVar14->m_streams[pSVar14->m_verbosity];
          sVar12 = strlen((char *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar12);
          cVar2 = (char)pSVar14->m_streams[pSVar14->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar14->m_streams[pSVar14->m_verbosity] + -0x18) + cVar2
                         );
          std::ostream::put(cVar2);
          std::ostream::flush();
          (*pSVar14->_vptr_SPxOut[2])(pSVar14,&local_5d8);
        }
        iVar9 = strcmp(local_598.m_f0,"ENDATA");
        if (iVar9 == 0) {
          local_598.m_section = ENDATA;
          goto LAB_001affaf;
        }
        goto switchD_001afd8c_caseD_4e;
      }
      iVar9 = strcmp(local_598.m_f1,"LO");
      pcVar5 = local_598.m_f4;
      pcVar6 = local_598.m_f3;
      if ((((iVar9 != 0) &&
           (iVar9 = strcmp(pcVar11,"UP"), pcVar5 = local_598.m_f4, pcVar6 = local_598.m_f3,
           iVar9 != 0)) &&
          (iVar9 = strcmp(pcVar11,"FX"), pcVar5 = local_598.m_f4, pcVar6 = local_598.m_f3,
          iVar9 != 0)) &&
         ((iVar9 = strcmp(pcVar11,"LI"), pcVar5 = local_598.m_f4, pcVar6 = local_598.m_f3,
          iVar9 != 0 &&
          (iVar9 = strcmp(pcVar11,"UI"), pcVar5 = local_598.m_f4, pcVar6 = local_598.m_f3,
          iVar9 != 0)))) {
        pcVar5 = local_598.m_f3;
        pcVar6 = local_598.m_f2;
      }
      if ((pcVar6 != (char *)0x0) && (pcVar5 == (char *)0x0)) {
        MPSInput::insertName(&local_598,"_BND_",true);
      }
      if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
         (local_598.m_f3 == (char *)0x0)) goto switchD_001afd8c_caseD_4e;
      if (local_138[0].left._0_1_ == '\0') {
        spxSnprintf((char *)local_138,0x100,"%s");
      }
      iVar9 = strcmp((char *)local_138,local_598.m_f2);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar7,local_598.m_f3);
        pcVar11 = local_598.m_f4;
        if (-1 < (int)uVar10) {
          if (local_598.m_f4 == (char *)0x0) {
            local_648 = (_func_int *)0x0;
            this = local_5f0;
          }
          else {
            iVar9 = strcmp(local_598.m_f4,"-Inf");
            if ((iVar9 == 0) || (iVar9 = strcmp(pcVar11,"-inf"), iVar9 == 0)) {
              this = local_5f0;
              ::soplex::infinity::__tls_init();
              local_648 = p_Var18;
            }
            else {
              iVar9 = strcmp(pcVar11,"Inf");
              if (((iVar9 == 0) || (iVar9 = strcmp(pcVar11,"inf"), iVar9 == 0)) ||
                 ((iVar9 = strcmp(pcVar11,"+Inf"), iVar9 == 0 ||
                  (iVar9 = strcmp(pcVar11,"+inf"), iVar9 == 0)))) {
                this = local_5f0;
                ::soplex::infinity::__tls_init();
                local_648 = local_608;
              }
              else {
                local_648 = (_func_int *)atof(pcVar11);
                this = local_5f0;
              }
            }
          }
          if (local_598.m_f1[1] == 'I') {
            if (local_5e8 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_5e8,uVar10);
            }
            iVar9 = IdxSet::pos((IdxSet *)local_238,uVar10);
            if (iVar9 < 0) {
              ::soplex::infinity::__tls_init();
              (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = (double)local_608;
              DIdxSet::addIdx((DIdxSet *)local_238,uVar10);
            }
          }
          cVar2 = *local_598.m_f1;
          pSVar14 = (SPxOut *)pVVar1;
          switch(cVar2) {
          case 'L':
            pSVar14 = local_5f8;
            break;
          case 'M':
            ::soplex::infinity::__tls_init();
            pSVar14 = local_5f8;
            local_648 = p_Var18;
            break;
          case 'N':
          case 'O':
          case 'Q':
          case 'R':
          case 'S':
          case 'T':
            goto switchD_001afd8c_caseD_4e;
          case 'P':
            ::soplex::infinity::__tls_init();
            local_648 = local_608;
            break;
          case 'U':
            break;
          default:
            if (cVar2 == 'B') {
              local_5f8->_vptr_SPxOut[uVar10] = (_func_int *)0x0;
              (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = 1.0;
              if (local_5e8 != (DIdxSet *)0x0) {
                DIdxSet::addIdx(local_5e8,uVar10);
              }
              goto LAB_001afa58;
            }
            if (cVar2 != 'F') goto switchD_001afd8c_caseD_4e;
            if (local_598.m_f1[1] == 'X') {
              local_5f8->_vptr_SPxOut[uVar10] = local_648;
            }
            else {
              ::soplex::infinity::__tls_init();
              local_5f8->_vptr_SPxOut[uVar10] = p_Var18;
              ::soplex::infinity::__tls_init();
              local_648 = local_608;
            }
          }
          pSVar14->_vptr_SPxOut[uVar10] = local_648;
          goto LAB_001afa58;
        }
        MPSInput::entryIgnored(&local_598,"column",local_598.m_f3,"bound",(char *)local_138);
      }
      goto LAB_001afa58;
    }
switchD_001afd8c_caseD_4e:
    MPSInput::syntaxError(&local_598);
LAB_001affaf:
    DIdxSet::~DIdxSet((DIdxSet *)local_238);
  }
  if (local_598.m_section != ENDATA) {
    MPSInput::syntaxError(&local_598);
  }
  if (local_598.m_has_error == true) {
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])(this);
  }
  else {
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x45])
              (this,(ulong)(((local_598.m_objsense != MINIMIZE) - 1) +
                           (uint)(local_598.m_objsense != MINIMIZE)));
    pSVar14 = this->spxout;
    if ((pSVar14 != (SPxOut *)0x0) && (3 < (int)pSVar14->m_verbosity)) {
      local_138[0].left = (double)CONCAT44(local_138[0].left._4_4_,pSVar14->m_verbosity);
      local_238[0].up = (double)CONCAT44(local_238[0].up._4_4_,4);
      (*pSVar14->_vptr_SPxOut[2])();
      pSVar14 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar14->m_streams[pSVar14->m_verbosity],"IMPSRD06 Objective sense: ",0x1a);
      pcVar11 = "Maximize\n";
      if (local_598.m_objsense == MINIMIZE) {
        pcVar11 = "Minimize\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar14->m_streams[pSVar14->m_verbosity],pcVar11,9);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_138);
    }
    added2Set(this,(SVSetBase<double> *)this,&local_5b8->super_SVSetBase<double>,
              (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                 thenum);
  }
  if (local_5b0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_618);
    free(local_618);
    local_618 = (NameSet *)0x0;
  }
  if (local_5a8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_610);
    free(local_610);
  }
  return (bool)(local_598.m_has_error ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}